

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O1

value_type_conflict1 __thiscall
CCDPP_MPI::rank_one_update
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *to_update,value_type_conflict1 *global_the_other,
          int start_to_update_id,int end_to_update_id,int workload)

{
  pool *ppVar1;
  double *pdVar2;
  int iVar3;
  int to_update_size;
  vector<double,_std::allocator<double>_> fun_dec;
  allocator_type local_89;
  int local_88;
  int local_84;
  double local_80;
  value_type_conflict1 *local_78;
  value_type_conflict1 *local_70;
  vector<double,_std::allocator<double>_> local_68;
  function0<void> local_50;
  
  local_88 = end_to_update_id - start_to_update_id;
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_84 = start_to_update_id;
  local_78 = global_the_other;
  local_70 = to_update;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,
             &local_89);
  if (0 < this->parameter->num_of_thread) {
    iVar3 = 0;
    do {
      ppVar1 = this->thread_pool;
      local_50.super_function_base.vtable = (vtable_base *)0x0;
      local_50.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x48);
      *(int **)local_50.super_function_base.functor.members._0_8_ = &workload;
      *(int **)((long)local_50.super_function_base.functor.members._0_8_ + 8) = &local_88;
      *(int **)((long)local_50.super_function_base.functor.members._0_8_ + 0x10) = &local_84;
      *(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
        **)((long)local_50.super_function_base.functor.members._0_8_ + 0x18) = _R;
      *(CCDPP_MPI **)((long)local_50.super_function_base.functor.members._0_8_ + 0x20) = this;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x28) =
           &local_78;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x30) =
           &local_70;
      *(vector<double,_std::allocator<double>_> **)
       ((long)local_50.super_function_base.functor.members._0_8_ + 0x38) = &local_68;
      *(int *)((long)local_50.super_function_base.functor.members._0_8_ + 0x40) = iVar3;
      local_50.super_function_base.vtable =
           (vtable_base *)
           _ZZN5boost9function0IvE9assign_toISt5_BindIFZN9CCDPP_MPI15rank_one_updateERSt13unordered_mapIiSt6vectorISt4pairIidESaIS8_EESt4hashIiESt8equal_toIiESaIS7_IKiSA_EEEPdSK_iiiEUliE_iEEEEvT_E13stored_vtable
      ;
      boost::threadpool::detail::
      pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
      ::schedule((ppVar1->m_core).px,&local_50);
      boost::function0<void>::~function0(&local_50);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->parameter->num_of_thread);
  }
  boost::threadpool::detail::
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((this->thread_pool->m_core).px,(void *)0x0);
  local_80 = 0.0;
  for (pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    local_80 = local_80 + *pdVar2;
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_80;
}

Assistant:

inline value_type rank_one_update(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *to_update,
                                      value_type *global_the_other, const int start_to_update_id, const int end_to_update_id, const int workload) {

        int to_update_size = end_to_update_id - start_to_update_id; // exclusive
        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, to_update_size);

                value_type prev_value;

                for (int to_update_id = start_to_update_id + start; to_update_id < start_to_update_id + end; to_update_id++) {

                    vector<pair<int, value_type > > &vec = _R[to_update_id];

                    // empty column
                    if (vec.size() == 0) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * vec.size();

                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p = vec[i];

                        numerator += global_the_other[p.first] * p.second;
                        denominator += global_the_other[p.first] * global_the_other[p.first];
                    }

                    int to_update_index = to_update_id - start_to_update_id;
                    prev_value = to_update[to_update_index];
                    to_update[to_update_index] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[to_update_index]);
                }
            },thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }